

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O3

int socket_server_bind(socket_server *ss,uintptr_t opaque,int fd)

{
  int iVar1;
  request_package request;
  request_package rStack_228;
  
  iVar1 = reserve_id(ss);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    rStack_228.u.open.id = iVar1;
    rStack_228.u.open.port = fd;
    rStack_228.u.open.opaque = opaque;
    send_request(ss,&rStack_228,'B',0x10);
  }
  return iVar1;
}

Assistant:

int
socket_server_bind(struct socket_server *ss, uintptr_t opaque, int fd) {
	struct request_package request;
	int id = reserve_id(ss);
	if (id < 0)
		return -1;
	request.u.bind.opaque = opaque;
	request.u.bind.id = id;
	request.u.bind.fd = fd;
	send_request(ss, &request, 'B', sizeof(request.u.bind));
	return id;
}